

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall IRBuilder::BuildBr(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  ByteCodeReader *this_00;
  RealCount *pRVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  OpCode OVar5;
  uint uVar6;
  LayoutSize LVar7;
  undefined4 *puVar8;
  OpLayoutBr *pOVar9;
  Type pSVar10;
  BranchInstr *branchInstr;
  SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
  *pSVar11;
  ulong uVar12;
  LayoutSize targetOffset_00;
  LayoutSize local_40;
  uint32 local_3c;
  LayoutSize layoutSize;
  uint32 offset_local;
  uint targetOffset;
  
  local_3c = offset;
  offset_local = offset;
  bVar4 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1c98,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar4) goto LAB_004c5a77;
    *puVar8 = 0;
  }
  this_00 = &this->m_jnReader;
  pOVar9 = Js::ByteCodeReader::Br(this_00);
  uVar6 = Js::ByteCodeReader::GetCurrentOffset(this_00);
  targetOffset_00 = (int)pOVar9->RelativeJumpOffset + uVar6;
  layoutSize = targetOffset_00;
  OVar5 = Js::ByteCodeReader::PeekOp(this_00,&local_40);
  if (OVar5 == BrLong) {
    ConsumeBranchIsland(this);
  }
  if (newOpcode == EndSwitch) {
    SwitchIRBuilder::EndSwitch(&this->m_switchBuilder,offset_local,targetOffset_00);
    return;
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,PerfHintPhase);
  if (((ushort)(newOpcode - TryCatch) < 2) && (bVar4)) {
    WritePerfHint(HasTryBlock,this->m_func,offset_local);
  }
  if ((OVar5 == BrLong) &&
     (LVar7 = Js::ByteCodeReader::GetCurrentOffset(this_00), targetOffset_00 == LVar7)) {
    if (this->m_offsetToInstructionCount <= offset_local) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1cb8,"(offset < m_offsetToInstructionCount)",
                         "offset < m_offsetToInstructionCount");
      if (!bVar4) goto LAB_004c5a77;
      *puVar8 = 0;
    }
    uVar12 = (ulong)offset_local;
    pIVar2 = this->m_offsetToInstruction[uVar12];
    if (pIVar2 == (Instr *)0x0) {
      this->m_offsetToInstruction[uVar12] = (Instr *)&DAT_ffffffffffffffff;
      JsUtil::
      BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,unsigned_int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this->longBranchMap,&local_3c,&layoutSize);
      return;
    }
    if ((pIVar2->m_opcode != StatementBoundary) &&
       ((bVar4 = Js::ConfigFlagsTable::IsEnabled
                           ((ConfigFlagsTable *)&Js::Configuration::Global,
                            BailOutAtEveryByteCodeFlag), !bVar4 ||
        (this->m_offsetToInstruction[uVar12]->m_opcode != BailOnEqual)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1cc9,
                         "(m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag) && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual))"
                         ,
                         "m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag) && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual)"
                        );
      if (!bVar4) {
LAB_004c5a77:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
  }
  if (newOpcode == TryFinally) {
    pSVar11 = this->handlerOffsetStack;
    if (pSVar11 ==
        (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) goto LAB_004c5a2b;
    uVar12 = 0x10000000000;
  }
  else {
    if ((newOpcode != TryCatch) ||
       (pSVar11 = this->handlerOffsetStack,
       pSVar11 ==
       (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
        *)0x0)) goto LAB_004c5a2b;
    uVar12 = 0x10100000000;
  }
  pSVar10 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar11->allocator,0x364470);
  pSVar10[1].next = (Type)(targetOffset_00 | uVar12);
  pSVar10->next =
       (pSVar11->
       super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
       ).super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pSVar11->
  super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
  ).super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar10;
  pRVar1 = &(pSVar11->
            super_SListBase<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
            ).super_RealCount;
  pRVar1->count = pRVar1->count + 1;
LAB_004c5a2b:
  branchInstr = IR::BranchInstr::New(newOpcode,(LabelInstr *)0x0,this->m_func);
  AddBranchInstr(this,branchInstr,offset_local,targetOffset_00);
  return;
}

Assistant:

void
IRBuilder::BuildBr(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    IR::BranchInstr * branchInstr;
    const unaligned   Js::OpLayoutBr *branchInsn = m_jnReader.Br();
    unsigned int      targetOffset = m_jnReader.GetCurrentOffset() + branchInsn->RelativeJumpOffset;
#ifdef BYTECODE_BRANCH_ISLAND
    bool isLongBranchIsland = (m_jnReader.PeekOp() == Js::OpCode::BrLong);
    if (isLongBranchIsland)
    {
        ConsumeBranchIsland();
    }
#endif

    if(newOpcode == Js::OpCode::EndSwitch)
    {
        m_switchBuilder.EndSwitch(offset, targetOffset);
        return;
    }
#ifdef PERF_HINT
    else if (PHASE_TRACE1(Js::PerfHintPhase) && (newOpcode == Js::OpCode::TryCatch || newOpcode == Js::OpCode::TryFinally) )
    {
        WritePerfHint(PerfHints::HasTryBlock, this->m_func, offset);
    }
#endif

#ifdef BYTECODE_BRANCH_ISLAND
    if (isLongBranchIsland && (targetOffset == (uint)m_jnReader.GetCurrentOffset()))
    {
        // Branch to next (probably after consume branch island), try to not emit the branch

        // Mark the jump around instruction as a virtual long branch as well so we can just
        // fall through instead of branch to exit
        Assert(offset < m_offsetToInstructionCount);
        if (m_offsetToInstruction[offset] == nullptr)
        {
            m_offsetToInstruction[offset] = VirtualLongBranchInstr;
            longBranchMap->Add(offset, targetOffset);
            return;
        }

        // We may have already create an instruction on this offset as a statement boundary
        // or in the bailout at every byte code case.

        // The statement boundary case only happens if we have emitted the long branch island
        // after an existing no fall through instruction, but that instruction also happen to be
        // branch to next.  We will just generate an actual branch to next instruction.

        Assert(m_offsetToInstruction[offset]->m_opcode == Js::OpCode::StatementBoundary
            || (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryByteCodeFlag)
            && m_offsetToInstruction[offset]->m_opcode == Js::OpCode::BailOnEqual));
    }
#endif

    if ((newOpcode == Js::OpCode::TryCatch) && this->handlerOffsetStack)
    {
        this->handlerOffsetStack->Push(Pair<uint, bool>(targetOffset, true));
    }
    else if ((newOpcode == Js::OpCode::TryFinally) && this->handlerOffsetStack)
    {
        this->handlerOffsetStack->Push(Pair<uint, bool>(targetOffset, false));
    }
    branchInstr = IR::BranchInstr::New(newOpcode, nullptr, m_func);
    this->AddBranchInstr(branchInstr, offset, targetOffset);
}